

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall dmlc::JSONWriter::WriteArraySeperator(JSONWriter *this)

{
  reference pvVar1;
  JSONWriter *this_local;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->scope_counter_);
  if (*pvVar1 != 0) {
    (anonymous_namespace)::Extend<char_const*>(this->os_,", ");
  }
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->scope_counter_);
  *pvVar1 = *pvVar1 + 1;
  WriteSeperator(this);
  return;
}

Assistant:

inline void JSONWriter::WriteArraySeperator() {
  if (scope_counter_.back() != 0) {
    Extend(os_, ", ");
  }
  scope_counter_.back() += 1;
  WriteSeperator();
}